

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O0

PerspectiveCamera *
create_perspective_camera
          (PerspectiveCamera *__return_storage_ptr__,Vec3 pos,Vec3 target,float ratio,float fov)

{
  float fVar1;
  Vec3 VVar2;
  PerspectiveCamera *cam;
  undefined8 local_180;
  float local_178;
  undefined8 local_140;
  float local_138;
  undefined8 local_c0;
  float local_b8;
  float fov_local;
  float ratio_local;
  Vec3 target_local;
  Vec3 pos_local;
  
  (__return_storage_ptr__->eye).z = pos.z;
  (__return_storage_ptr__->eye).x = (float)(int)pos._0_8_;
  (__return_storage_ptr__->eye).y = (float)(int)((ulong)pos._0_8_ >> 0x20);
  __return_storage_ptr__->depth = 1.0;
  VVar2 = vsub(pos,target);
  VVar2 = normalized(VVar2);
  local_b8 = VVar2.z;
  local_c0 = VVar2._0_8_;
  __return_storage_ptr__->basis[2].z = local_b8;
  __return_storage_ptr__->basis[2].x = (float)(undefined4)local_c0;
  __return_storage_ptr__->basis[2].y = (float)local_c0._4_4_;
  VVar2.z = 1.0;
  VVar2.x = 0.00123;
  VVar2.y = -0.000987;
  VVar2 = cross(VVar2,__return_storage_ptr__->basis[2]);
  VVar2 = normalized(VVar2);
  local_138 = VVar2.z;
  local_140 = VVar2._0_8_;
  __return_storage_ptr__->basis[0].z = local_138;
  __return_storage_ptr__->basis[0].x = (float)(undefined4)local_140;
  __return_storage_ptr__->basis[0].y = (float)local_140._4_4_;
  VVar2 = cross(__return_storage_ptr__->basis[2],__return_storage_ptr__->basis[0]);
  local_180 = VVar2._0_8_;
  local_178 = VVar2.z;
  __return_storage_ptr__->basis[1].x = (float)(undefined4)local_180;
  __return_storage_ptr__->basis[1].y = (float)local_180._4_4_;
  __return_storage_ptr__->basis[1].z = local_178;
  fVar1 = atanf((fov * 3.1415927) / 360.0);
  __return_storage_ptr__->xscale = fVar1;
  __return_storage_ptr__->yscale = __return_storage_ptr__->xscale / ratio;
  return __return_storage_ptr__;
}

Assistant:

PerspectiveCamera create_perspective_camera(Vec3 pos, Vec3 target, float ratio, float fov) {
    PerspectiveCamera cam;
    cam.eye = pos;
    cam.depth = 1.0f;

    cam.basis[2] = normalized(vsub(pos, target));
    cam.basis[0] = normalized(
        cross((Vec3) {0.00123f, -0.000987f, 1.0f}, cam.basis[2])
        );
    cam.basis[1] = cross(cam.basis[2], cam.basis[0]);

    cam.xscale = atanf(fov * PI / 360.0f);
    cam.yscale = cam.xscale / ratio;

    return cam;
}